

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O2

void outputPtrBytes(void *val,char *outBuf,int32_t *outIx,int32_t capacity)

{
  long lVar1;
  void *val_local;
  
  val_local = val;
  for (lVar1 = 7; (int)lVar1 != -1; lVar1 = lVar1 + -1) {
    outputHexBytes((long)*(char *)((long)&val_local + lVar1),2,outBuf,outIx,capacity);
  }
  return;
}

Assistant:

static void outputPtrBytes(void *val, char *outBuf, int32_t *outIx, int32_t capacity) {
    uint32_t  i;
    int32_t  incVal = 1;              /* +1 for big endian, -1 for little endian          */
    char     *p     = (char *)&val;   /* point to current byte to output in the ptr val  */

#if !U_IS_BIG_ENDIAN
    /* Little Endian.  Move p to most significant end of the value      */
    incVal = -1;
    p += sizeof(void *) - 1;
#endif

    /* Loop through the bytes of the ptr as it sits in memory, from 
     * most significant to least significant end                    */
    for (i=0; i<sizeof(void *); i++) {
        outputHexBytes(*p, 2, outBuf, outIx, capacity);
        p += incVal;
    }
}